

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseFrexp::test(ShaderBitfieldOperationCaseFrexp *this,Data *data)

{
  int iVar1;
  long lVar2;
  long lVar3;
  GLint __exponent;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  lVar2 = 0;
  while (lVar3 = lVar2, iVar1 = this->m_components, lVar3 < iVar1) {
    fVar6 = data->outVec4[lVar3];
    if ((data->inVec4[lVar3] != 0.0) || (NAN(data->inVec4[lVar3]))) {
      uVar4 = -(uint)(-fVar6 <= fVar6);
      fVar5 = (float)(~uVar4 & (uint)-fVar6 | uVar4 & (uint)fVar6);
      if ((fVar5 < 0.5) || (1.0 <= fVar5)) break;
      __exponent = data->outIvec4[lVar3];
    }
    else if (((fVar6 != 0.0) || (NAN(fVar6))) || (__exponent = 0, data->outIvec4[lVar3] != 0))
    break;
    fVar5 = ldexpf(1.0,__exponent);
    fVar6 = fVar6 * fVar5 - data->inVec4[lVar3];
    uVar4 = -(uint)(-fVar6 <= fVar6);
    lVar2 = lVar3 + 1;
    if (0.0001 < (float)(~uVar4 & (uint)-fVar6 | (uint)fVar6 & uVar4)) break;
  }
  return iVar1 <= lVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			if (data->inVec4[i] == 0.0)
			{
				if (data->outVec4[i] != 0.0 || data->outIvec4[i] != 0)
				{
					return false;
				}
			}
			else if (deFloatAbs(data->outVec4[i]) < 0.5 || deFloatAbs(data->outVec4[i]) >= 1.0)
			{
				return false;
			}

			float result = data->outVec4[i] * deFloatPow(2.0, (float)data->outIvec4[i]);
			if (deFloatAbs(result - data->inVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}